

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_utils.cpp
# Opt level: O1

void amrex::FillSignedDistance
               (MultiFab *mf,Level *ls_lev,EBFArrayBoxFactory *eb_factory,int refratio,
               bool fluid_has_positive_sign)

{
  int iVar1;
  int *piVar2;
  undefined8 uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double *pdVar7;
  int iVar8;
  Real RVar9;
  double *pdVar10;
  Long LVar11;
  Long LVar12;
  Long LVar13;
  bool bVar14;
  int ifac;
  int iVar15;
  undefined4 extraout_EAX;
  int iVar16;
  Box *pBVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  size_type sVar29;
  pointer piVar30;
  pointer piVar31;
  int i_1;
  int iVar32;
  uint uVar33;
  int iVar34;
  int iVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  double dVar39;
  undefined1 auVar41 [16];
  double dVar40;
  double dVar43;
  undefined1 auVar42 [16];
  double dVar44;
  double dVar45;
  undefined1 auVar46 [16];
  double *pdVar47;
  int iVar50;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  double dVar51;
  int iVar53;
  double dVar52;
  double dVar54;
  double dVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined8 uVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  double dVar67;
  Periodicity PVar68;
  Box eb_search;
  Real dzinv;
  IntVect ind_facets;
  DeviceVector<GpuArray<Real,_3_*_2>_> facets;
  DeviceVector<int> cutcell_offset;
  DeviceVector<int> is_cut;
  RealVect facet_normal;
  RealVect c_vec_tmp;
  RealVect facet_p0;
  RealVect edge_v;
  RealVect edge_p0;
  MFIter mfi;
  double local_7f8;
  Box local_748;
  double local_728;
  double dStack_720;
  double *local_718;
  double dStack_710;
  double local_708;
  undefined8 uStack_700;
  double *local_6f8;
  double *pdStack_6f0;
  MultiCutFab *local_6e0;
  long local_6d8;
  long local_6d0;
  long local_6c8;
  long local_6c0;
  Real local_6b8;
  double *local_6b0;
  double *local_6a8;
  long local_6a0;
  double *local_698;
  long local_690;
  double *local_688;
  double local_680;
  int local_674;
  uint local_670;
  int local_66c;
  int local_668;
  Box local_664;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  double local_628;
  undefined8 uStack_620;
  double local_618;
  undefined8 uStack_610;
  undefined1 local_608 [16];
  double local_5f8;
  double dStack_5f0;
  pointer local_5e8;
  undefined4 uStack_5e0;
  undefined4 uStack_5dc;
  pointer local_5d8;
  undefined4 uStack_5d0;
  uint uStack_5cc;
  undefined1 local_5c8 [16];
  double local_5b8;
  undefined8 uStack_5b0;
  double local_5a8;
  double dStack_5a0;
  double local_598;
  ulong uStack_590;
  Level *local_588;
  FabArray<amrex::EBCellFlagFab> *local_580;
  ulong local_578;
  ulong local_570;
  uint local_568;
  long local_560;
  undefined4 local_558;
  int local_554 [3];
  undefined1 local_548 [16];
  double local_538;
  double dStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  double local_518;
  ulong uStack_510;
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  size_type local_4e8;
  undefined1 local_4d8 [16];
  size_type local_4c8;
  undefined1 local_4b8 [16];
  size_type local_4a8;
  undefined1 local_498 [16];
  double local_488;
  undefined4 local_478;
  uint uStack_474;
  undefined4 uStack_470;
  uint uStack_46c;
  undefined1 local_468 [16];
  double local_458;
  double dStack_450;
  double local_448 [4];
  double *local_428;
  double dStack_420;
  double local_418;
  double *local_408;
  double dStack_400;
  double local_3f8;
  Real local_3e8;
  long local_3e0;
  long local_3d8;
  long local_3d0;
  double *local_3c8;
  long local_3c0;
  long local_3b8;
  long local_3b0;
  long local_3a8;
  double *local_3a0;
  Real local_398;
  Real RStack_390;
  Array4<double> local_388;
  MultiCutFab *local_348;
  MultiCutFab *local_340;
  MultiCutFab *local_338;
  double local_330 [3];
  Periodicity local_318;
  undefined4 uStack_30c;
  double local_308;
  Real local_300;
  Real RStack_2f8;
  double local_2f0;
  uint local_2e8;
  pointer local_2e0;
  double local_2d8;
  double local_2d0;
  double *local_2c8;
  long lStack_2c0;
  long local_2b8;
  Long LStack_2b0;
  ulong local_288;
  double local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  double local_228;
  undefined8 uStack_220;
  double local_218;
  double dStack_210;
  double local_208 [4];
  double local_1e8 [3];
  Array4<const_double> local_1d0;
  MFIter local_190;
  Array4<const_double> local_130;
  Array4<const_double> local_f0;
  Array4<const_double> local_b0;
  Array4<const_amrex::EBCellFlag> local_70;
  
  local_674 = refratio;
  bVar14 = FabArrayBase::is_nodal((FabArrayBase *)mf);
  if (!bVar14) {
    Assert_host("mf.is_nodal()",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB_utils.cpp"
                ,0x1d6,(char *)0x0);
  }
  EB2::Level::fillLevelSet(ls_lev,mf,&ls_lev->m_geom);
  local_6e0 = EBDataCollection::getBndryCent
                        ((eb_factory->m_ebdc).
                         super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  EBDataCollection::getAreaFrac
            ((eb_factory->m_ebdc).
             super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_580 = EBDataCollection::getMultiEBCellFlagFab
                        ((eb_factory->m_ebdc).
                         super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (fluid_has_positive_sign) {
    local_648 = 0x3ff0000000000000;
  }
  else {
    local_648 = 0xbff0000000000000;
  }
  uStack_640 = 0;
  local_5f8 = (eb_factory->m_geom).super_CoordSys.dx[0];
  dStack_5f0 = (eb_factory->m_geom).super_CoordSys.dx[1];
  iVar21 = (local_580->super_FabArrayBase).n_grow.vect[0];
  local_5b8 = (eb_factory->m_geom).super_CoordSys.dx[2];
  uStack_5b0 = 0;
  iVar50 = (local_6e0->m_data).super_FabArrayBase.n_grow.vect[0];
  local_398 = (ls_lev->m_geom).super_CoordSys.dx[0];
  RStack_390 = (ls_lev->m_geom).super_CoordSys.dx[1];
  local_3e8 = (ls_lev->m_geom).super_CoordSys.dx[2];
  local_588 = ls_lev;
  MFIter::MFIter(&local_190,(FabArrayBase *)mf,'\0');
  if (local_190.currentIndex < local_190.endIndex) {
    auVar6._8_8_ = dStack_5f0;
    auVar6._0_8_ = local_5f8;
    dVar52 = dStack_5f0;
    if (local_5f8 <= dStack_5f0) {
      dVar52 = local_5f8;
    }
    local_458 = dStack_5f0;
    dStack_450 = dStack_5f0;
    dVar55 = dStack_5f0;
    if (dStack_5f0 <= local_5f8) {
      dVar55 = local_5f8;
    }
    dVar39 = local_5b8;
    if (dVar52 <= local_5b8) {
      dVar39 = dVar52;
    }
    dVar39 = (double)(iVar21 + 1) * dVar39;
    local_278 = local_5b8;
    if (local_5b8 <= dVar55) {
      local_278 = dVar55;
    }
    uStack_474 = local_648._4_4_ ^ 0x80000000;
    uStack_46c = uStack_640._4_4_ ^ 0x80000000;
    local_478 = (undefined4)local_648;
    uStack_470 = (undefined4)uStack_640;
    local_508 = divpd(_DAT_0078ba10,auVar6);
    local_680 = 1.0 / local_5b8;
    uStack_270 = uStack_5b0;
    local_228 = local_278 + dVar39;
    uStack_220 = uStack_5b0;
    local_268 = CONCAT44(iVar50,iVar50);
    uStack_260 = 0;
    local_218 = local_508._8_8_;
    local_238._8_8_ = local_5b8;
    local_238._0_8_ = local_5b8;
    local_248._8_8_ = local_5f8;
    local_248._0_8_ = local_5f8;
    local_258 = iVar50;
    iStack_254 = iVar50;
    iStack_250 = iVar50;
    iStack_24c = iVar50;
    dStack_210 = local_218;
    do {
      FabArrayBase::fabbox
                (&local_664,local_190.fabArray,
                 ((local_190.index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[local_190.currentIndex]);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_388,&mf->super_FabArray<amrex::FArrayBox>,&local_190);
      bVar14 = MultiCutFab::ok(local_6e0,&local_190);
      auVar49 = _DAT_0077bb40;
      auVar6 = _DAT_0077bb30;
      if (bVar14) {
        FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  (&local_70,local_580,&local_190);
        BATransformer::operator()
                  (&local_748,&((local_190.fabArray)->boxarray).m_bat,
                   (Box *)((long)((local_190.index_map)->super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[local_190.currentIndex] * 0x1c +
                          *(long *)&((((local_190.fabArray)->boxarray).m_ref.
                                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data));
        pBVar17 = Box::coarsen(&local_748,local_674);
        lVar22 = 0;
        do {
          if (((pBVar17->btype).itype >> ((uint)lVar22 & 0x1f) & 1) != 0) {
            piVar2 = (pBVar17->bigend).vect + lVar22;
            *piVar2 = *piVar2 + -1;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 3);
        (pBVar17->btype).itype = 0;
        iVar21 = (pBVar17->smallend).vect[1];
        iVar50 = (pBVar17->smallend).vect[2];
        iVar53 = (pBVar17->bigend).vect[0];
        (pBVar17->smallend).vect[0] = (pBVar17->smallend).vect[0] - local_258;
        (pBVar17->smallend).vect[1] = iVar21 - iStack_254;
        (pBVar17->smallend).vect[2] = iVar50 - iStack_250;
        (pBVar17->bigend).vect[0] = iVar53 + iStack_24c;
        uVar3 = *(undefined8 *)((pBVar17->bigend).vect + 1);
        *(ulong *)((pBVar17->bigend).vect + 1) =
             CONCAT44((int)((ulong)uVar3 >> 0x20) + local_268._4_4_,(int)uVar3 + (int)local_268);
        uVar27 = ((local_748.bigend.vect[2] - local_748.smallend.vect[2]) + 1) *
                 ((local_748.bigend.vect[0] - local_748.smallend.vect[0]) + 1) *
                 ((local_748.bigend.vect[1] - local_748.smallend.vect[1]) + 1);
        uVar37 = (ulong)(int)uVar27;
        local_4b8 = (undefined1  [16])0x0;
        local_4a8 = 0;
        uVar36 = 0x10;
        sVar29 = 0x10;
        if (0x10 < uVar37) {
          do {
            sVar29 = sVar29 * 3 + 1 >> 1;
          } while (sVar29 < uVar37);
        }
        PODVector<int,_std::allocator<int>_>::AllocateBuffer
                  ((PODVector<int,_std::allocator<int>_> *)local_4b8,sVar29);
        local_4b8._8_8_ = uVar37;
        local_5d8 = (pointer)local_4b8._0_8_;
        local_4d8 = (undefined1  [16])0x0;
        local_4c8 = 0;
        if (0x10 < uVar37) {
          uVar36 = 0x10;
          do {
            uVar36 = uVar36 * 3 + 1 >> 1;
          } while (uVar36 < uVar37);
        }
        PODVector<int,_std::allocator<int>_>::AllocateBuffer
                  ((PODVector<int,_std::allocator<int>_> *)local_4d8,uVar36);
        local_4d8._8_8_ = uVar37;
        local_5e8 = (pointer)local_4d8._0_8_;
        if ((int)uVar27 < 1) {
          uVar25 = 0;
        }
        else {
          lVar22 = ((long)local_748.bigend.vect[0] - (long)local_748.smallend.vect[0]) + 1;
          lVar38 = (long)(((local_748.bigend.vect[1] - local_748.smallend.vect[1]) + 1) *
                         (int)lVar22);
          uVar36 = 0;
          uVar33 = 0;
          do {
            lVar26 = (long)uVar36 % lVar38;
            uVar25 = (uint)((local_70.p
                             [((int)(lVar26 / lVar22) +
                              (local_748.smallend.vect[1] - local_70.begin.y)) * local_70.jstride +
                              (long)((int)(lVar26 % lVar22) +
                                    (local_748.smallend.vect[0] - local_70.begin.x)) +
                              ((int)((long)uVar36 / lVar38) +
                              (local_748.smallend.vect[2] - local_70.begin.z)) * local_70.kstride].
                             flag & 3) == 1);
            local_5d8[uVar36] = uVar25;
            uVar25 = uVar25 + uVar33;
            *(uint *)(local_4d8._0_8_ + uVar36 * 4) = uVar33;
            uVar36 = uVar36 + 1;
            uVar33 = uVar25;
          } while ((uVar27 & 0x7fffffff) != uVar36);
        }
        if (0 < (int)uVar25) {
          local_4f8 = (undefined1  [16])0x0;
          local_4e8 = 0;
          sVar29 = 1;
          if (uVar25 != 1) {
            do {
              sVar29 = sVar29 * 3 + 1 >> 1;
            } while (sVar29 < uVar25);
          }
          local_670 = uVar25;
          PODVector<amrex::GpuArray<double,_6U>,_std::allocator<amrex::GpuArray<double,_6U>_>_>::
          AllocateBuffer((PODVector<amrex::GpuArray<double,_6U>,_std::allocator<amrex::GpuArray<double,_6U>_>_>
                          *)local_4f8,sVar29);
          uVar3 = local_4f8._0_8_;
          local_4f8._8_4_ = uVar25;
          local_4f8._12_4_ = 0;
          local_578 = (ulong)uVar25;
          MultiCutFab::const_array(&local_1d0,local_6e0,&local_190);
          MultiCutFab::const_array(&local_b0,local_348,&local_190);
          MultiCutFab::const_array(&local_f0,local_340,&local_190);
          MultiCutFab::const_array(&local_130,local_338,&local_190);
          pdVar47 = local_b0.p;
          LVar13 = local_130.jstride;
          pdVar10 = local_130.p;
          iVar50 = local_1d0.begin.x;
          LVar12 = local_1d0.nstride;
          LVar11 = local_1d0.jstride;
          iVar21 = local_748.smallend.vect[1];
          local_6d8 = CONCAT44(local_6d8._4_4_,local_748.bigend.vect[2]);
          if (local_748.smallend.vect[2] <= local_748.bigend.vect[2]) {
            local_688 = (double *)(ulong)(uint)local_748.bigend.vect[0];
            local_3a0 = local_1d0.p;
            local_3a8 = local_1d0.kstride;
            local_538 = (double)CONCAT44(local_538._4_4_,local_748.smallend.vect[0]);
            local_668 = (local_748.bigend.vect[0] - local_748.smallend.vect[0]) + 1;
            local_548._0_4_ = local_748.bigend.vect[1];
            lVar22 = local_1d0.nstride << 4;
            iVar32 = -local_b0.begin.x;
            uVar36 = (ulong)(uint)-local_130.begin.x;
            dVar52 = (double)(ulong)(uint)-local_f0.begin.x;
            local_690 = CONCAT44(local_690._4_4_,local_668);
            local_668 = ((local_748.bigend.vect[1] - local_748.smallend.vect[1]) + 1) * local_668;
            lVar38 = (long)local_1d0.begin.y;
            local_3b0 = (long)local_1d0.begin.z;
            local_6b0 = (double *)local_b0.jstride;
            local_3b8 = local_b0.kstride;
            local_6b8 = (Real)(long)local_b0.begin.y;
            local_3c0 = (long)local_b0.begin.z;
            local_3c8 = local_f0.p;
            local_6c0 = local_f0.jstride;
            local_3d0 = local_f0.kstride;
            local_6c8 = CONCAT44(local_6c8._4_4_,local_f0.begin.y);
            local_3d8 = (long)local_f0.begin.z;
            local_3e0 = local_130.kstride;
            local_6d0 = (long)local_130.begin.y;
            local_66c = local_130.begin.z;
            uVar27 = 0;
            local_708 = (double)CONCAT44(local_708._4_4_,local_748.bigend.vect[0] + 1);
            piVar30 = local_5d8;
            piVar31 = local_5e8;
            local_728 = dVar52;
            local_638 = uVar36;
            local_528 = lVar22;
            iVar53 = local_748.smallend.vect[2];
            do {
              if (iVar21 <= (int)local_548._0_4_) {
                auVar49._0_8_ = (double)iVar53;
                auVar49._8_8_ = 0;
                lVar26 = (long)iVar53;
                local_698 = local_3a0 + (lVar26 - local_3b0) * local_3a8;
                local_6a0 = (lVar26 - local_3c0) * local_3b8;
                local_6a8 = local_3c8 + (lVar26 - local_3d8) * local_3d0;
                local_598 = (double)(local_3e0 * (iVar53 - local_66c));
                local_5a8 = (double)(((iVar53 - local_66c) + 1) * local_3e0);
                local_468._0_8_ = auVar49._0_8_;
                uVar25 = uVar27;
                iVar35 = iVar21;
                do {
                  pdVar7 = local_698;
                  lVar26 = local_6a0;
                  if (local_538._0_4_ <= (int)local_688) {
                    lVar28 = (ulong)uVar25 << 0x20;
                    auVar48._0_8_ = (double)iVar35;
                    auVar48._8_8_ = 0;
                    lVar18 = (long)iVar35;
                    lVar23 = (lVar18 - lVar38) * LVar11;
                    lVar24 = (lVar18 - (long)local_6b8) * (long)local_6b0;
                    local_718 = local_6a8 + local_6c0 * (iVar35 - (int)local_6c8);
                    uVar37 = (ulong)local_708 & 0xffffffff;
                    local_6f8 = local_6a8 + ((iVar35 - (int)local_6c8) + 1) * local_6c0;
                    lVar18 = (lVar18 - local_6d0) * LVar13;
                    iVar34 = local_538._0_4_;
                    local_518 = auVar48._0_8_;
                    do {
                      if (*(int *)((long)piVar30 + (lVar28 >> 0x1e)) != 0) {
                        iVar4 = piVar31[lVar28 >> 0x20];
                        lVar19 = (long)(iVar34 - iVar50);
                        ((pointer)(uVar3 + (long)iVar4 * 0x30))->arr[0] =
                             ((double)iVar34 + pdVar7[lVar23 + lVar19] + 0.5) * local_5f8;
                        ((pointer)(uVar3 + (long)iVar4 * 0x30))->arr[1] =
                             (pdVar7[lVar23 + lVar19 + LVar12] + auVar48._0_8_ + 0.5) * local_458;
                        ((pointer)(uVar3 + (long)iVar4 * 0x30))->arr[2] =
                             (*(double *)((long)pdVar7 + lVar22 + lVar19 * 8 + lVar23 * 8) +
                              auVar49._0_8_ + 0.5) * local_5b8;
                        dVar55 = pdVar47[lVar24 + lVar26 + (iVar32 + iVar34)];
                        dVar54 = pdVar47[lVar24 + lVar26 + (iVar32 + 1 + iVar34)];
                        iVar15 = SUB84(dVar52,0) + iVar34;
                        dVar44 = local_718[iVar15];
                        dVar43 = local_6f8[iVar15];
                        auVar62._8_8_ = 0;
                        auVar62._0_8_ = dVar43;
                        lVar19 = (long)((int)uVar36 + iVar34);
                        dVar45 = pdVar10[lVar18 + lVar19 + (long)local_598];
                        dVar51 = pdVar10[lVar18 + lVar19 + (long)local_5a8];
                        dVar40 = dVar45 - dVar51;
                        dVar40 = dVar40 * dVar40 +
                                 (dVar55 - dVar54) * (dVar55 - dVar54) +
                                 (dVar44 - dVar43) * (dVar44 - dVar43);
                        if (dVar40 < 0.0) {
                          local_608._8_8_ = 0;
                          local_608._0_8_ = dVar54;
                          uStack_610 = 0.0;
                          uStack_620 = 0;
                          local_628 = dVar44;
                          local_618 = dVar55;
                          local_5c8 = auVar62;
                          dVar40 = sqrt(dVar40);
                          auVar48._8_8_ = 0;
                          auVar48._0_8_ = local_518;
                          auVar49._8_8_ = 0;
                          auVar49._0_8_ = (double)local_468._0_8_;
                          uVar37 = (ulong)local_708 & 0xffffffff;
                          dVar52 = local_728;
                          piVar30 = local_5d8;
                          piVar31 = local_5e8;
                          lVar22 = local_528;
                          uVar36 = local_638;
                          dVar54 = (double)local_608._0_8_;
                          dVar55 = local_618;
                          dVar44 = local_628;
                          dVar43 = (double)local_5c8._0_8_;
                        }
                        else {
                          dVar40 = SQRT(dVar40);
                        }
                        dVar40 = 1.0 / dVar40;
                        ((pointer)(uVar3 + (long)iVar4 * 0x30))->arr[3] =
                             dVar40 * -(dVar54 - dVar55);
                        ((pointer)(uVar3 + (long)iVar4 * 0x30))->arr[4] =
                             dVar40 * -(dVar43 - dVar44);
                        ((pointer)(uVar3 + (long)iVar4 * 0x30))->arr[5] =
                             -(dVar51 - dVar45) * dVar40;
                      }
                      iVar34 = iVar34 + 1;
                      lVar28 = lVar28 + 0x100000000;
                    } while ((int)uVar37 != iVar34);
                  }
                  uVar25 = uVar25 + (int)local_690;
                  bVar14 = iVar35 != local_548._0_4_;
                  iVar35 = iVar35 + 1;
                } while (bVar14);
              }
              uVar27 = uVar27 + local_668;
              bVar14 = iVar53 != (int)local_6d8;
              iVar53 = iVar53 + 1;
            } while (bVar14);
          }
          pdVar10 = local_388.p;
          RVar9 = local_3e8;
          iVar53 = local_664.bigend.vect[1];
          iVar50 = local_664.smallend.vect[1];
          iVar21 = local_664.smallend.vect[0];
          local_318.period.vect._0_8_ = local_5f8;
          local_318.period.vect[2] = SUB84(dStack_5f0,0);
          uStack_30c = (undefined4)((ulong)dStack_5f0 >> 0x20);
          local_308 = local_5b8;
          local_300 = local_398;
          RStack_2f8 = RStack_390;
          local_2f0 = local_3e8;
          local_2e8 = local_670;
          local_2e0 = (pointer)uVar3;
          local_2d0 = local_278;
          local_2b8 = local_388.kstride;
          LStack_2b0 = local_388.nstride;
          local_2c8 = local_388.p;
          lStack_2c0 = local_388.jstride;
          local_288 = local_648;
          local_6d0 = CONCAT44(local_6d0._4_4_,local_664.bigend.vect[2]);
          local_2d8 = dVar39;
          if (local_664.smallend.vect[2] <= local_664.bigend.vect[2]) {
            local_6b8 = RStack_390;
            local_690 = (long)local_388.begin.x;
            local_6c0 = (long)local_388.begin.y;
            local_6c8 = local_388.jstride;
            lVar22 = (long)local_388.begin.z;
            local_6d8 = local_388.kstride;
            local_698 = (double *)uVar3 + 2;
            local_6a8 = (double *)CONCAT44(local_6a8._4_4_,local_664.bigend.vect[0]);
            uVar36 = local_578;
            iVar35 = local_664.bigend.vect[0];
            iVar32 = local_664.smallend.vect[2];
            do {
              if (iVar50 <= iVar53) {
                dVar52 = (double)iVar32 * RVar9;
                local_6b0 = pdVar10 + (iVar32 - lVar22) * local_6d8;
                iVar34 = iVar50;
                do {
                  if (iVar21 <= iVar35) {
                    dVar55 = (double)iVar34 * local_6b8;
                    local_688 = local_6b0 + (iVar34 - local_6c0) * local_6c8;
                    iVar4 = iVar21;
                    do {
                      local_5c8._0_8_ = (double)iVar4 * local_398;
                      local_5c8._8_8_ = 0;
                      uVar20 = 0;
                      uVar37 = 0;
                      dVar54 = 1.79769313486232e+308;
                      pdVar47 = local_698;
                      do {
                        dVar44 = (double)local_5c8._0_8_ -
                                 ((GpuArray<double,_6U> *)(pdVar47 + -2))->arr[0];
                        dStack_720 = 0.0;
                        dVar44 = (dVar52 - *pdVar47) * (dVar52 - *pdVar47) +
                                 dVar44 * dVar44 + (dVar55 - pdVar47[-1]) * (dVar55 - pdVar47[-1]);
                        if (dVar44 < dVar54) {
                          uVar37 = uVar20 & 0xffffffff;
                          dVar54 = dVar44;
                        }
                        uVar20 = uVar20 + 1;
                        pdVar47 = pdVar47 + 6;
                      } while (uVar36 != uVar20);
                      iVar15 = (int)uVar37;
                      local_628 = ((pointer)(uVar3 + (long)iVar15 * 0x30))->arr[2];
                      uStack_620 = 0;
                      local_618 = ((pointer)(uVar3 + (long)iVar15 * 0x30))->arr[3];
                      local_708 = (((pointer)(uVar3 + (long)iVar15 * 0x30))->arr + 3)[1];
                      local_518 = ((pointer)(uVar3 + (long)iVar15 * 0x30))->arr[5];
                      auVar63._8_8_ = local_618;
                      auVar63._0_8_ = local_518;
                      local_468 = auVar63 ^ _DAT_0077bb00;
                      local_538 = ((pointer)(uVar3 + (long)iVar15 * 0x30))->arr[0];
                      dStack_530 = ((pointer)(uVar3 + (long)iVar15 * 0x30))->arr[1];
                      local_548._8_8_ = dStack_530;
                      local_548._0_8_ = dStack_530;
                      local_728 = (dVar52 - local_628) * local_468._0_8_ +
                                  (((double)local_5c8._0_8_ - local_538) * local_468._8_8_ -
                                  (dVar55 - dStack_530) * local_708);
                      uStack_510 = 0;
                      local_608._0_8_ = local_518 * local_728 + dVar52;
                      local_608._8_8_ = 0;
                      dVar43 = (double)local_508._8_8_ * dStack_530;
                      uStack_700 = local_708;
                      uStack_610 = local_708;
                      dVar44 = floor((double)local_508._0_8_ * local_538);
                      dVar43 = floor(dVar43);
                      local_638 = CONCAT44((int)dVar43,(int)dVar44);
                      uStack_630 = 0;
                      dVar44 = floor(local_680 * local_628);
                      uVar25 = (uint)dVar44;
                      dVar45 = local_728 * local_618 + (double)local_5c8._0_8_;
                      pdVar47 = (double *)(local_728 * uStack_610 + dVar55);
                      local_718 = (double *)((double)local_508._0_8_ * dVar45);
                      dStack_710 = (double)local_508._8_8_ * (double)pdVar47;
                      dVar44 = floor((double)local_718);
                      dVar43 = floor(dStack_710);
                      local_528 = CONCAT44((int)dVar43,(int)dVar44);
                      uStack_520 = 0;
                      dVar43 = floor(local_680 * (double)local_608._0_8_);
                      auVar42._0_4_ = -(uint)((int)local_638 == (int)local_528);
                      auVar42._4_4_ = auVar42._0_4_;
                      auVar42._8_4_ = -(uint)(local_638._4_4_ == local_528._4_4_);
                      auVar42._12_4_ = -(uint)(local_638._4_4_ == local_528._4_4_);
                      uVar27 = movmskpd(extraout_EAX,auVar42);
                      uVar27 = uVar25 ^ (int)dVar43 | uVar27 ^ 3;
                      uVar37 = (ulong)uVar27;
                      dVar44 = local_728;
                      if ((uVar27 != 0) && (ABS(local_728) <= local_228)) {
                        local_6a0 = CONCAT44(local_6a0._4_4_,(int)dVar43);
                        uStack_5cc = uStack_700._4_4_ ^ 0x80000000;
                        local_5d8 = (pointer)((ulong)local_708 ^ 0x8000000000000000);
                        uStack_5d0 = (undefined4)uStack_700;
                        local_5e8 = (pointer)((ulong)local_708 ^ 0x8000000000000000);
                        uStack_5e0 = (undefined4)uStack_610;
                        uStack_5dc = uStack_610._4_4_;
                        dVar44 = floor((local_5f8 * -1e-06 + dVar45) * (double)local_508._0_8_);
                        iVar35 = (int)dVar44;
                        iVar15 = (int)local_638;
                        iVar8 = local_638._4_4_;
                        iVar16 = -1;
                        local_7f8 = 0.0;
                        local_598 = (double)CONCAT44(local_598._4_4_,iVar35);
                        local_6f8 = pdVar47;
                        pdStack_6f0 = pdVar47;
                        do {
                          local_5a8 = (double)CONCAT44(local_5a8._4_4_,iVar16);
                          dVar44 = floor(((double)iVar16 * 1e-06 * local_5b8 +
                                         (double)local_608._0_8_) * local_680);
                          local_718 = (double *)((ulong)local_718 & 0xffffffff00000000);
                          iVar16 = -1;
                          do {
                            dVar43 = floor(((double)iVar16 * 1e-06 * local_458 + (double)local_6f8)
                                           * local_218);
                            if (((iVar15 == iVar35) && (iVar8 == (int)dVar43)) &&
                               (uVar25 == (int)dVar44)) {
                              bVar14 = false;
                              uVar37 = CONCAT71((int7)(uVar37 >> 8),1);
                              local_7f8 = (double)(uVar37 & 0xffffffff);
                            }
                            else {
                              iVar35 = -2;
                              do {
                                if (iVar35 == 0) {
                                  iVar35 = 1;
                                  goto LAB_0060a947;
                                }
                                dVar51 = floor(((double)(iVar35 + 2) * 1e-06 * local_5f8 + dVar45) *
                                               (double)local_508._0_8_);
                                iVar35 = iVar35 + 1;
                              } while (((iVar15 != (int)dVar51) || (iVar8 != (int)dVar43)) ||
                                      (uVar25 != (int)dVar44));
                              local_7f8 = 4.94065645841247e-324;
LAB_0060a947:
                              bVar14 = 0 < iVar35;
                              iVar35 = local_598._0_4_;
                            }
                            uVar36 = local_578;
                            if (!bVar14) break;
                            iVar1 = iVar16 + 1;
                            uVar37 = CONCAT71((int7)(uVar37 >> 8),0 < iVar16);
                            local_718 = (double *)CONCAT44(local_718._4_4_,(int)uVar37);
                            iVar16 = iVar1;
                          } while (iVar1 != 2);
                        } while ((((ulong)local_718 & 1) != 0) &&
                                (iVar16 = local_5a8._0_4_ + 1, iVar16 != 2));
                        iVar35 = (int)local_6a8;
                        dVar44 = local_728;
                        if (((ulong)local_7f8 & 1) == 0) {
                          local_560 = local_528;
                          local_558 = (undefined4)local_6a0;
                          local_570 = local_638;
                          local_568 = uVar25;
                          local_330[0] = (double)local_5c8._0_8_;
                          local_330[1] = dVar55;
                          local_330[2] = dVar52;
                          local_554[0] = 0;
                          local_554[1] = 0;
                          local_554[2] = 0;
                          lVar38 = 0;
                          uVar27 = 0;
                          do {
                            if (*(int *)((long)&local_560 + lVar38 * 4) !=
                                *(int *)((long)&local_570 + lVar38 * 4)) {
                              lVar26 = (long)(int)uVar27;
                              uVar27 = uVar27 + 1;
                              local_554[lVar26] = (int)lVar38;
                            }
                            lVar38 = lVar38 + 1;
                          } while (lVar38 != 3);
                          if ((int)uVar27 < 1) {
                            dVar44 = 0.0;
                            local_7f8 = 0.0;
                            local_6f8 = (double *)0x0;
                          }
                          else {
                            local_628 = local_628 * local_518 +
                                        local_538 * local_618 + (double)local_548._0_8_ * local_708;
                            local_708 = ABS(local_708);
                            uStack_700 = ABS(uStack_700);
                            local_598 = ABS(local_518);
                            uStack_590 = uStack_510 & 0x7fffffffffffffff;
                            uVar20 = (ulong)DAT_0077bb00;
                            uVar37 = DAT_0077bb00._8_8_;
                            local_5a8 = (double)((ulong)(double)(iVar15 + 1) ^ uVar20) *
                                        (double)local_248._0_8_;
                            dStack_5a0 = (double)((ulong)(double)(int)local_638 ^ uVar37) *
                                         (double)local_248._8_8_;
                            local_718 = (double *)(((double)(int)local_638 + 0.5) * local_5f8);
                            dStack_710 = ((double)local_638._4_4_ + 0.5) * dStack_5f0;
                            local_728 = (double)((ulong)(double)(int)(uVar25 + 1) ^ uVar20) *
                                        (double)local_238._0_8_;
                            dStack_720 = (double)((ulong)(double)(int)uVar25 ^ uVar37) *
                                         (double)local_238._8_8_;
                            uStack_620 = 0x3ff0000000000000;
                            dVar44 = 0.0;
                            local_6f8 = (double *)0x0;
                            local_608._0_8_ =
                                 (double)((ulong)(double)(iVar8 + 1) ^ uVar20) * local_458;
                            local_608._8_8_ =
                                 (double)((ulong)(double)local_638._4_4_ ^ uVar37) * dStack_450;
                            uVar37 = 0;
                            dVar43 = 1.79769313486232e+308;
                            local_7f8 = 0.0;
                            do {
                              lVar38 = (long)local_554[uVar37];
                              local_498 = (undefined1  [16])0x0;
                              local_488 = 0.0;
                              *(undefined8 *)(local_498 + lVar38 * 8) = 0x3ff0000000000000;
                              if ((((ABS(local_618) != ABS((double)local_498._0_8_)) ||
                                   (NAN(ABS(local_618)) || NAN(ABS((double)local_498._0_8_)))) ||
                                  (local_708 != ABS((double)local_498._8_8_))) ||
                                 (NAN(local_708) || NAN(ABS((double)local_498._8_8_)))) {
LAB_0060ac8e:
                                iVar15 = *(int *)((long)&local_570 + lVar38 * 4);
                                local_408 = local_718;
                                dStack_400 = dStack_710;
                                local_3f8 = ((double)(int)uVar25 + 0.5) * local_5b8;
                                (&local_408)[lVar38] =
                                     (double *)
                                     ((double)(int)((uint)(iVar15 < *(int *)((long)&local_560 +
                                                                            lVar38 * 4)) + iVar15) *
                                     *(double *)(local_318.period.vect + lVar38 * 2));
                                dVar45 = local_3f8 * local_488 +
                                         (double)local_498._0_8_ * (double)local_408 +
                                         (double)local_498._8_8_ * dStack_400;
                                dVar51 = local_518 * local_488 +
                                         (double)local_498._0_8_ *
                                         (double)CONCAT44(uStack_5dc,uStack_5e0) +
                                         (double)local_498._8_8_ * uStack_610;
                                dVar67 = 1.0 - dVar51 * dVar51;
                                dVar40 = (local_628 - dVar45 * dVar51) / dVar67;
                                dVar67 = (dVar51 * (double)((ulong)local_628 ^ uVar20) + dVar45) /
                                         dVar67;
                                local_1e8[2] = dVar40 * local_518 + local_488 * dVar67;
                                local_1e8[0] = dVar40 * local_618 + dVar67 * (double)local_498._0_8_
                                ;
                                local_1e8[1] = dVar40 * uStack_610 +
                                               dVar67 * (double)local_498._8_8_;
                                local_208[0] = local_488 * uStack_610 +
                                               (double)local_498._8_8_ * (double)local_468._0_8_;
                                local_208[1] = (double)local_498._0_8_ * local_518 +
                                               local_488 * (double)local_468._8_8_;
                                local_208[2] = local_618 * (double)local_498._8_8_ +
                                               (double)local_498._0_8_ * (double)local_5d8;
                                auVar64._8_8_ = local_208[1];
                                auVar64._0_8_ = local_208[1];
                                dVar45 = -((local_1e8[2] - dVar52) * local_208[2] +
                                          (local_1e8[0] - (double)local_5c8._0_8_) * local_208[0] +
                                          (local_1e8[1] - dVar55) * local_208[1]) /
                                         (local_208[2] * local_208[2] +
                                         local_208[0] * local_208[0] + local_208[1] * local_208[1]);
                                local_428 = (double *)(dVar45 * local_208[0] + local_1e8[0]);
                                dStack_420 = dVar45 * local_208[1] + local_1e8[1];
                                local_418 = dVar45 * local_208[2] + local_1e8[2];
                                auVar66 = _DAT_007862e0;
                                if ((2.220446049250313e-16 < ABS(local_208[0])) &&
                                   (auVar59._8_8_ = local_208[0], auVar59._0_8_ = local_208[0],
                                   auVar65._8_8_ = -(local_1e8[0] + dStack_5a0),
                                   auVar65._0_8_ = -(local_1e8[0] + local_5a8),
                                   auVar66 = divpd(auVar65,auVar59), 0.0 <= local_208[0])) {
                                  uVar58 = auVar66._8_8_;
                                  auVar66._8_8_ = auVar66._0_8_;
                                  auVar66._0_8_ = uVar58;
                                }
                                auVar57 = _DAT_007862e0;
                                if ((2.220446049250313e-16 < ABS(local_208[1])) &&
                                   (auVar56._8_8_ = -(local_1e8[1] + (double)local_608._8_8_),
                                   auVar56._0_8_ = -(local_1e8[1] + (double)local_608._0_8_),
                                   auVar57 = divpd(auVar56,auVar64), 0.0 <= local_208[1])) {
                                  uVar58 = auVar57._8_8_;
                                  auVar57._8_8_ = auVar57._0_8_;
                                  auVar57._0_8_ = uVar58;
                                }
                                auVar61 = _DAT_007862e0;
                                if ((2.220446049250313e-16 < ABS(local_208[2])) &&
                                   (auVar60._8_8_ = -(local_1e8[2] + dStack_720),
                                   auVar60._0_8_ = -(local_1e8[2] + local_728),
                                   auVar5._8_8_ = local_208[2], auVar5._0_8_ = local_208[2],
                                   auVar61 = divpd(auVar60,auVar5), 0.0 <= local_208[2])) {
                                  uVar58 = auVar61._8_8_;
                                  auVar61._8_8_ = auVar61._0_8_;
                                  auVar61._0_8_ = uVar58;
                                }
                                dVar51 = auVar57._0_8_;
                                if (auVar57._0_8_ <= auVar66._0_8_) {
                                  dVar51 = auVar66._0_8_;
                                }
                                dVar40 = auVar61._0_8_;
                                if (auVar61._0_8_ <= dVar51) {
                                  dVar40 = dVar51;
                                }
                                if (dVar40 <= dVar45) {
                                  dVar51 = auVar57._8_8_;
                                  if (auVar66._8_8_ <= auVar57._8_8_) {
                                    dVar51 = auVar66._8_8_;
                                  }
                                  dVar67 = auVar61._8_8_;
                                  if (dVar51 <= auVar61._8_8_) {
                                    dVar67 = dVar51;
                                  }
                                  dVar40 = dVar45;
                                  if (dVar67 < dVar45) {
                                    dVar40 = dVar67;
                                  }
                                }
                                local_448[0] = 0.0;
                                local_448[1] = 0.0;
                                local_448[2] = 0.0;
                                lVar38 = 0;
                                do {
                                  pdVar47 = (double *)
                                            (local_208[lVar38] * dVar40 + local_1e8[lVar38]);
                                  (&local_428)[lVar38] = pdVar47;
                                  local_448[lVar38] = (double)pdVar47 - local_330[lVar38];
                                  lVar38 = lVar38 + 1;
                                } while (lVar38 != 3);
                                dVar45 = local_448[2] * local_448[2] +
                                         local_448[0] * local_448[0] + local_448[1] * local_448[1];
                                if (dVar45 < dVar43) {
                                  local_6f8 = local_428;
                                  local_7f8 = dStack_420;
                                  dVar43 = dVar45;
                                  dVar44 = local_418;
                                }
                              }
                              else if ((local_598 != ABS(local_488)) ||
                                      (NAN(local_598) || NAN(ABS(local_488)))) goto LAB_0060ac8e;
                              uVar37 = uVar37 + 1;
                            } while (uVar37 != uVar27);
                          }
                          dVar44 = (dVar44 - dVar52) * (dVar44 - dVar52) +
                                   ((double)local_6f8 - (double)local_5c8._0_8_) *
                                   ((double)local_6f8 - (double)local_5c8._0_8_) +
                                   (local_7f8 - dVar55) * (local_7f8 - dVar55);
                          if (dVar54 <= dVar44) {
                            dVar44 = dVar54;
                          }
                          if (dVar44 < 0.0) {
                            dVar44 = sqrt(dVar44);
                          }
                          else {
                            dVar44 = SQRT(dVar44);
                          }
                          dVar44 = -dVar44;
                        }
                      }
                      dVar54 = ABS(dVar44);
                      if (dVar39 <= ABS(dVar44)) {
                        dVar54 = dVar39;
                      }
                      local_688[iVar4 - local_690] =
                           dVar54 * (double)(~-(ulong)(0.0 < local_688[iVar4 - local_690]) &
                                             local_648 |
                                            -(ulong)(0.0 < local_688[iVar4 - local_690]) &
                                            CONCAT44(uStack_474,local_478));
                      bVar14 = iVar4 != iVar35;
                      iVar4 = iVar4 + 1;
                    } while (bVar14);
                  }
                  bVar14 = iVar34 != iVar53;
                  iVar34 = iVar34 + 1;
                } while (bVar14);
              }
              bVar14 = iVar32 != (int)local_6d0;
              iVar32 = iVar32 + 1;
            } while (bVar14);
          }
          Gpu::Device::streamSynchronize();
          if ((pointer)local_4f8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_4f8._0_8_,local_4e8 * 0x30);
          }
        }
        if ((pointer)local_4d8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_4d8._0_8_,local_4c8 << 2);
        }
        if ((pointer)local_4b8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_4b8._0_8_,local_4a8 << 2);
        }
      }
      else if (local_664.smallend.vect[2] <= local_664.bigend.vect[2]) {
        uVar27 = local_664.bigend.vect[0] - local_664.smallend.vect[0];
        auVar41._4_4_ = 0;
        auVar41._0_4_ = uVar27;
        auVar41._8_4_ = uVar27;
        auVar41._12_4_ = 0;
        iVar21 = local_664.smallend.vect[2];
        do {
          if (local_664.smallend.vect[1] <= local_664.bigend.vect[1]) {
            lVar38 = (long)local_388.p +
                     ((long)iVar21 - (long)local_388.begin.z) * local_388.kstride * 8 +
                     (long)local_664.smallend.vect[0] * 8 +
                     ((long)local_664.smallend.vect[1] - (long)local_388.begin.y) *
                     local_388.jstride * 8 + (long)local_388.begin.x * -8 + 8;
            lVar22 = (long)local_664.smallend.vect[1];
            do {
              if (local_664.smallend.vect[0] <= local_664.bigend.vect[0]) {
                uVar36 = 0;
                do {
                  auVar46._8_4_ = (int)uVar36;
                  auVar46._0_8_ = uVar36;
                  auVar46._12_4_ = (int)(uVar36 >> 0x20);
                  auVar48 = auVar41 ^ auVar49;
                  auVar46 = (auVar46 | auVar6) ^ auVar49;
                  bVar14 = auVar48._0_4_ < auVar46._0_4_;
                  iVar50 = auVar48._4_4_;
                  iVar53 = auVar46._4_4_;
                  if ((bool)(~(iVar50 < iVar53 || iVar53 == iVar50 && bVar14) & 1)) {
                    uVar37 = -(ulong)(0.0 < *(double *)(lVar38 + -8 + uVar36 * 8));
                    *(double *)(lVar38 + -8 + uVar36 * 8) =
                         (double)(~uVar37 & local_648 | uVar37 & CONCAT44(uStack_474,local_478)) *
                         dVar39;
                  }
                  if (iVar50 >= iVar53 && (iVar53 != iVar50 || !bVar14)) {
                    uVar37 = -(ulong)(0.0 < *(double *)(lVar38 + uVar36 * 8));
                    *(double *)(lVar38 + uVar36 * 8) =
                         (double)(~uVar37 & local_648 | uVar37 & CONCAT44(uStack_474,local_478)) *
                         dVar39;
                  }
                  uVar36 = uVar36 + 2;
                } while (((ulong)uVar27 + 2 & 0xfffffffffffffffe) != uVar36);
              }
              lVar22 = lVar22 + 1;
              lVar38 = lVar38 + local_388.jstride * 8;
            } while (local_664.bigend.vect[1] + 1 != (int)lVar22);
          }
          bVar14 = iVar21 != local_664.bigend.vect[2];
          iVar21 = iVar21 + 1;
        } while (bVar14);
      }
      MFIter::operator++(&local_190);
    } while (local_190.currentIndex < local_190.endIndex);
  }
  MFIter::~MFIter(&local_190);
  PVar68 = Geometry::periodicity(&local_588->m_geom);
  local_318.period.vect._0_8_ = PVar68.period.vect._0_8_;
  local_318.period.vect[2] = PVar68.period.vect[2];
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&mf->super_FabArray<amrex::FArrayBox>,0,1,&local_318,false);
  return;
}

Assistant:

void FillSignedDistance (MultiFab& mf, EB2::Level const& ls_lev,
                         EBFArrayBoxFactory const& eb_factory, int refratio,
                         bool fluid_has_positive_sign)
{
    AMREX_ALWAYS_ASSERT(mf.is_nodal());

    ls_lev.fillLevelSet(mf, ls_lev.Geom()); // This is the implicit function, not the SDF.

    const auto& bndrycent = eb_factory.getBndryCent();
    const auto& areafrac = eb_factory.getAreaFrac();
    const auto& flags = eb_factory.getMultiEBCellFlagFab();
    const int eb_pad = bndrycent.nGrow();

    const auto dx_ls = ls_lev.Geom().CellSizeArray();
    const auto dx_eb = eb_factory.Geom().CellSizeArray();
    Real dx_eb_max = amrex::max(AMREX_D_DECL(dx_eb[0],dx_eb[1],dx_eb[2]));
    Real ls_roof = amrex::min(AMREX_D_DECL(dx_eb[0],dx_eb[1],dx_eb[2])) * (flags.nGrow()+1);

    Real fluid_sign = fluid_has_positive_sign ? 1._rt : -1._rt;

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf); mfi.isValid(); ++mfi)
    {
        Box const& gbx = mfi.fabbox();
        Array4<Real> const& fab = mf.array(mfi);

        if (bndrycent.ok(mfi))
        {
            const auto& flag = flags.const_array(mfi);

            Box eb_search = mfi.validbox();
            eb_search.coarsen(refratio).enclosedCells().grow(eb_pad);

            const int nallcells = eb_search.numPts();

            Gpu::DeviceVector<int> is_cut(nallcells);
            int* p_is_cut = is_cut.data();

            Gpu::DeviceVector<int> cutcell_offset(nallcells);
            int* p_cutcell_offset = cutcell_offset.data();

            int ncutcells = Scan::PrefixSum<int>
                (nallcells,
                 [=] AMREX_GPU_DEVICE (int icell) -> int
                 {
                     GpuArray<int,3> ijk = eb_search.atOffset3d(icell);
                     int is_cut_cell = flag(ijk[0],ijk[1],ijk[2]).isSingleValued();
                     p_is_cut[icell] = is_cut_cell;
                     return is_cut_cell;
                 },
                 [=] AMREX_GPU_DEVICE (int icell, int const& x)
                 {
                     p_cutcell_offset[icell] = x;
                 },
                 Scan::Type::exclusive, Scan::retSum);

            if (ncutcells > 0) {
                Gpu::DeviceVector<GpuArray<Real,AMREX_SPACEDIM*2> > facets(ncutcells);
                auto p_facets = facets.data();
                Array4<Real const> const& bcent = bndrycent.const_array(mfi);
                AMREX_D_TERM(Array4<Real const> const& apx = areafrac[0]->const_array(mfi);,
                             Array4<Real const> const& apy = areafrac[1]->const_array(mfi);,
                             Array4<Real const> const& apz = areafrac[2]->const_array(mfi));
                amrex::ParallelFor(eb_search, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                    int icell = eb_search.index(IntVect(AMREX_D_DECL(i,j,k)));
                    if (p_is_cut[icell]) {
                        GpuArray<Real,AMREX_SPACEDIM*2>& fac = p_facets[p_cutcell_offset[icell]];
                        AMREX_D_TERM(fac[0] = (bcent(i,j,k,0)+Real(i)+0.5_rt) * dx_eb[0];,
                                     fac[1] = (bcent(i,j,k,1)+Real(j)+0.5_rt) * dx_eb[1];,
                                     fac[2] = (bcent(i,j,k,2)+Real(k)+0.5_rt) * dx_eb[2]);

                         Real axm = apx(i,  j  , k  );
                         Real axp = apx(i+1,j  , k  );
                         Real aym = apy(i,  j  , k  );
                         Real ayp = apy(i,  j+1, k  );
#if (AMREX_SPACEDIM == 3)
                         Real azm = apz(i,  j  , k  );
                         Real azp = apz(i,  j  , k+1);
                         Real apnorm = std::sqrt((axm-axp)*(axm-axp) +
                                                 (aym-ayp)*(aym-ayp) +
                                                 (azm-azp)*(azm-azp));
#else
                         Real apnorm = std::sqrt((axm-axp)*(axm-axp) +
                                                 (aym-ayp)*(aym-ayp));
#endif
                         Real apnorminv = 1._rt / apnorm;
                         AMREX_D_TERM(Real anrmx = (axp-axm) * apnorminv;,   // pointing to the wall
                                      Real anrmy = (ayp-aym) * apnorminv;,
                                      Real anrmz = (azp-azm) * apnorminv);

                         // pointing to the fluid
                         AMREX_D_TERM(fac[AMREX_SPACEDIM+0] = -anrmx;,
                                      fac[AMREX_SPACEDIM+1] = -anrmy;,
                                      fac[AMREX_SPACEDIM+2] = -anrmz);
                    }
                });

                amrex::ParallelFor(gbx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                    AMREX_D_TERM(Real dxinv = 1._rt/dx_eb[0];,
                                 Real dyinv = 1._rt/dx_eb[1];,
                                 Real dzinv = 1._rt/dx_eb[2]);
                    AMREX_D_TERM(Real x = i*dx_ls[0];,
                                 Real y = j*dx_ls[1];,
                                 Real z = k*dx_ls[2]);
                    Real min_dist2 = std::numeric_limits<Real>::max();
                    int i_nearest = 0;
                    for (int ifac  = 0; ifac < ncutcells; ++ifac) {
                        AMREX_D_TERM(Real cx = p_facets[ifac][0];,
                                     Real cy = p_facets[ifac][1];,
                                     Real cz = p_facets[ifac][2]);
                        Real dist2 = AMREX_D_TERM((x-cx)*(x-cx),+(y-cy)*(y-cy),+(z-cz)*(z-cz));
                        if (dist2 < min_dist2) {
                            i_nearest = ifac;
                            min_dist2 = dist2;
                        }
                    }

                    // Test if pos "projects onto" the nearest EB facet's interior
                    AMREX_D_TERM(Real cx = p_facets[i_nearest][0];,
                                 Real cy = p_facets[i_nearest][1];,
                                 Real cz = p_facets[i_nearest][2]);
                    AMREX_D_TERM(Real nx = p_facets[i_nearest][AMREX_SPACEDIM+0];,
                                 Real ny = p_facets[i_nearest][AMREX_SPACEDIM+1];,
                                 Real nz = p_facets[i_nearest][AMREX_SPACEDIM+2]);
                    Real dist_proj = AMREX_D_TERM((x-cx)*(-nx),+(y-cy)*(-ny),+(z-cz)*(-nz));
                    AMREX_D_TERM(Real eb_min_x = x + nx*dist_proj;,
                                 Real eb_min_y = y + ny*dist_proj;,
                                 Real eb_min_z = z + nz*dist_proj);
                    AMREX_D_TERM(int vi_cx = static_cast<int>(amrex::Math::floor(cx * dxinv));,
                                 int vi_cy = static_cast<int>(amrex::Math::floor(cy * dyinv));,
                                 int vi_cz = static_cast<int>(amrex::Math::floor(cz * dzinv)));
                    AMREX_D_TERM(int vi_x = static_cast<int>(amrex::Math::floor(eb_min_x * dxinv));,
                                 int vi_y = static_cast<int>(amrex::Math::floor(eb_min_y * dyinv));,
                                 int vi_z = static_cast<int>(amrex::Math::floor(eb_min_z * dzinv)));

                    bool min_pt_valid = false;
                    if ((AMREX_D_TERM(vi_cx == vi_x, && vi_cy == vi_y, && vi_cz == vi_z))  ||
                        amrex::Math::abs(dist_proj) > ls_roof + dx_eb_max)
                    {
                        // If the distance is very big, we can set it to true as well.
                        // Later the signed distance will be assigned the roof value.
                        min_pt_valid = true;
                    } else { // rounding error might give false negatives
#if (AMREX_SPACEDIM == 3)
                        for (int k_shift = -1; k_shift <= 1; ++k_shift) {
#endif
                        for (int j_shift = -1; j_shift <= 1; ++j_shift) {
                        for (int i_shift = -1; i_shift <= 1; ++i_shift) {
                            AMREX_D_TERM(vi_x = static_cast<int>(amrex::Math::floor((eb_min_x+i_shift*1.e-6_rt*dx_eb[0])*dxinv));,
                                         vi_y = static_cast<int>(amrex::Math::floor((eb_min_y+j_shift*1.e-6_rt*dx_eb[1])*dyinv));,
                                         vi_z = static_cast<int>(amrex::Math::floor((eb_min_z+k_shift*1.e-6_rt*dx_eb[2])*dzinv)));
                            if (AMREX_D_TERM(vi_cx == vi_x, && vi_cy == vi_y, && vi_cz == vi_z)) {
                                min_pt_valid = true;
                                goto after_loops;
                            }
                        }}
#if (AMREX_SPACEDIM == 3)
                        }
#endif
                        after_loops:;
                    }

                    // If projects onto nearest EB facet, then return projected distance
                    // Alternatively: find the nearest point on the EB edge
                    Real min_dist;
                    if ( min_pt_valid ) {
                        // this is a signed distance function
                        min_dist = dist_proj;
                    } else {
                        // fallback: find the nearest point on the EB edge
                        // revert the value of vi_x, vi_y and vi_z
                        AMREX_D_TERM(vi_x = static_cast<int>(amrex::Math::floor(eb_min_x * dxinv));,
                                     vi_y = static_cast<int>(amrex::Math::floor(eb_min_y * dyinv));,
                                     vi_z = static_cast<int>(amrex::Math::floor(eb_min_z * dzinv)));
                        auto c_vec = detail::facets_nearest_pt
                            ({AMREX_D_DECL(vi_x,vi_y,vi_z)}, {AMREX_D_DECL(vi_cx, vi_cy, vi_cz)},
                             {AMREX_D_DECL(x,y,z)}, {AMREX_D_DECL(nx,ny,nz)},
                             {AMREX_D_DECL(cx,cy,cz)}, dx_eb);
                        Real min_edge_dist2 = AMREX_D_TERM( (c_vec[0]-x)*(c_vec[0]-x),
                                                           +(c_vec[1]-y)*(c_vec[1]-y),
                                                           +(c_vec[2]-z)*(c_vec[2]-z));
                        min_dist = -std::sqrt(amrex::min(min_dist2, min_edge_dist2));
                    }

                    Real usd = amrex::min(ls_roof,amrex::Math::abs(min_dist));
                    if (fab(i,j,k) <= 0._rt) {
                        fab(i,j,k) = fluid_sign * usd;
                    } else {
                        fab(i,j,k) = (-fluid_sign) * usd;
                    }
                });
                Gpu::streamSynchronize();
            }
        } else {
            amrex::ParallelFor(gbx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                if (fab(i,j,k) <= 0._rt) {
                    fab(i,j,k) = fluid_sign * ls_roof;
                } else {
                    fab(i,j,k) = (-fluid_sign) * ls_roof;
                }
            });
        }
    }

    mf.FillBoundary(0,1,ls_lev.Geom().periodicity());
}

}